

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O2

void __thiscall xray_re::way_link_io::operator()(way_link_io *this,way_link *link,xr_writer *w)

{
  uint16_t local_20;
  uint16_t local_1e;
  float local_1c;
  
  local_20 = link->from;
  (*w->_vptr_xr_writer[2])(w,&local_20,2);
  local_1e = link->to;
  (*w->_vptr_xr_writer[2])(w,&local_1e,2);
  local_1c = link->weight;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  return;
}

Assistant:

void way_link_io::operator()(const way_link& link, xr_writer& w) const
{
	w.w_u16(link.from);
	w.w_u16(link.to);
	w.w_float(link.weight);
}